

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *p,Gia_Obj_t *pObj1,Gia_Obj_t *pObj2)

{
  Cec_ParSat_t *pCVar1;
  sat_solver *s;
  Gia_Obj_t *pGVar2;
  ABC_INT64_T AVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pObj;
  timespec ts;
  timespec local_50;
  undefined8 local_40;
  long local_38;
  
  if ((((Gia_Obj_t *)((ulong)pObj2 ^ 1) == pObj1) || (pGVar7 = p->pAig->pObjs, pGVar7 == pObj1)) ||
     (pGVar7 == pObj2)) {
    return 1;
  }
  pCVar1 = p->pPars;
  local_38 = (long)pCVar1->nBTLimit;
  if (((Gia_Obj_t *)((ulong)pGVar7 ^ 1) == pObj1) &&
     ((pObj2 == (Gia_Obj_t *)0x0 || (pObj1 == pObj2)))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,0x245,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  pGVar7 = (Gia_Obj_t *)((ulong)pObj1 & 0xfffffffffffffffe);
  iVar4 = p->nCallsSince;
  p->nCallsSince = iVar4 + 1;
  p->nSatTotal = p->nSatTotal + 1;
  pObj = (Gia_Obj_t *)((ulong)pObj2 & 0xfffffffffffffffe);
  if ((p->pSat == (sat_solver *)0x0) ||
     (((pCVar1->nSatVarMax != 0 && (pCVar1->nSatVarMax < p->nSatVars)) &&
      (pCVar1->nCallsRecycle <= iVar4)))) {
    Cec_ManSatSolverRecycle(p);
  }
  clock_gettime(3,&local_50);
  Cec_CnfNodeAddToSolver(p,pGVar7);
  Cec_CnfNodeAddToSolver(p,pObj);
  clock_gettime(3,&local_50);
  s = p->pSat;
  if (s->qtail != s->qhead) {
    iVar4 = sat_solver_simplify(s);
    if (iVar4 == 0) {
      __assert_fail("status != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                    ,0x263,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    if (p->pSat->qtail != p->pSat->qhead) {
      __assert_fail("p->pSat->qtail == p->pSat->qhead",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                    ,0x264,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
  }
  pGVar2 = p->pAig->pObjs;
  if ((pGVar2 <= pGVar7) && (pGVar7 < pGVar2 + p->pAig->nObjs)) {
    iVar4 = ((uint)pObj1 & 1) +
            p->pSatVars[(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555] * 2;
    local_40 = CONCAT44(local_40._4_4_,iVar4);
    if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->pAig->nObjs)) {
      iVar5 = ((uint)pObj2 & 1) +
              p->pSatVars[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555] * 2;
      local_40 = CONCAT44(iVar5,iVar4);
      if (p->pPars->fPolarFlip != 0) {
        if (*(long *)pGVar7 < 0) {
          local_40 = CONCAT44(iVar5,iVar4) ^ 1;
        }
        if (*(long *)pObj < 0) {
          local_40 = CONCAT44(iVar5,(lit)local_40) ^ 0x100000000;
        }
      }
      iVar4 = clock_gettime(3,&local_50);
      if (iVar4 < 0) {
        iVar4 = -1;
      }
      else {
        iVar4 = (int)(local_50.tv_nsec / 1000) + (int)local_50.tv_sec * 1000000;
      }
      AVar3 = (p->pSat->stats).conflicts;
      clock_gettime(3,&local_50);
      iVar5 = sat_solver_solve(p->pSat,(lit *)&local_40,(lit *)&local_38,local_38,0,0,0);
      iVar6 = (int)AVar3;
      if (iVar5 == 1) {
        iVar5 = clock_gettime(3,&local_50);
        if (iVar5 < 0) {
          iVar5 = -1;
        }
        else {
          iVar5 = (int)(local_50.tv_nsec / 1000) + (int)local_50.tv_sec * 1000000;
        }
        p->timeSatSat = p->timeSatSat + (iVar5 - iVar4);
        p->nSatSat = p->nSatSat + 1;
        p->nConfSat = p->nConfSat + ((int)(p->pSat->stats).conflicts - iVar6);
        return 0;
      }
      if (iVar5 != -1) {
        iVar5 = clock_gettime(3,&local_50);
        if (iVar5 < 0) {
          iVar5 = -1;
        }
        else {
          iVar5 = (int)(local_50.tv_nsec / 1000) + (int)local_50.tv_sec * 1000000;
        }
        p->timeSatUndec = p->timeSatUndec + (iVar5 - iVar4);
        p->nSatUndec = p->nSatUndec + 1;
        p->nConfUndec = p->nConfUndec + ((int)(p->pSat->stats).conflicts - iVar6);
        return -1;
      }
      iVar5 = clock_gettime(3,&local_50);
      if (iVar5 < 0) {
        iVar5 = -1;
      }
      else {
        iVar5 = (int)(local_50.tv_nsec / 1000) + (int)local_50.tv_sec * 1000000;
      }
      p->timeSatUnsat = p->timeSatUnsat + (iVar5 - iVar4);
      local_40 = local_40 ^ 0x100000001;
      iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
      if (iVar4 != 0) {
        p->nSatUnsat = p->nSatUnsat + 1;
        p->nConfUnsat = p->nConfUnsat + ((int)(p->pSat->stats).conflicts - iVar6);
        return 1;
      }
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                    ,0x27f,"int Cec_ManSatCheckNodeTwo(Cec_ManSat_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Cec_ManSatCheckNodeTwo( Cec_ManSat_t * p, Gia_Obj_t * pObj1, Gia_Obj_t * pObj2 )
{
    Gia_Obj_t * pObjR1 = Gia_Regular(pObj1);
    Gia_Obj_t * pObjR2 = Gia_Regular(pObj2);
    int nBTLimit = p->pPars->nBTLimit;
    int Lits[2], RetValue, status, nConflicts;
    abctime clk, clk2;

    if ( pObj1 == Gia_ManConst0(p->pAig) || pObj2 == Gia_ManConst0(p->pAig) || pObj1 == Gia_Not(pObj2) )
        return 1;
    if ( pObj1 == Gia_ManConst1(p->pAig) && (pObj2 == NULL || pObj2 == Gia_ManConst1(p->pAig)) )
    {
        assert( 0 );
        return 0;
    }

    p->nCallsSince++;  // experiment with this!!!
    p->nSatTotal++;
    
    // check if SAT solver needs recycling
    if ( p->pSat == NULL || 
        (p->pPars->nSatVarMax && 
         p->nSatVars > p->pPars->nSatVarMax && 
         p->nCallsSince > p->pPars->nCallsRecycle) )
        Cec_ManSatSolverRecycle( p );

    // if the nodes do not have SAT variables, allocate them
clk2 = Abc_Clock();
    Cec_CnfNodeAddToSolver( p, pObjR1 );
    Cec_CnfNodeAddToSolver( p, pObjR2 );
//ABC_PRT( "cnf", Abc_Clock() - clk2 );
//Abc_Print( 1, "%d \n", p->pSat->size );

clk2 = Abc_Clock();
//    Cec_SetActivityFactors( p, pObjR1 ); 
//    Cec_SetActivityFactors( p, pObjR2 ); 
//ABC_PRT( "act", Abc_Clock() - clk2 );

    // propage unit clauses
    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    Lits[0] = toLitCond( Cec_ObjSatNum(p,pObjR1), Gia_IsComplement(pObj1) );
    Lits[1] = toLitCond( Cec_ObjSatNum(p,pObjR2), Gia_IsComplement(pObj2) );
    if ( p->pPars->fPolarFlip )
    {
        if ( pObjR1->fPhase )  Lits[0] = lit_neg( Lits[0] );
        if ( pObjR2->fPhase )  Lits[1] = lit_neg( Lits[1] );
    }
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
clk = Abc_Clock();
    nConflicts = p->pSat->stats.conflicts;

clk2 = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, Lits, Lits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//ABC_PRT( "sat", Abc_Clock() - clk2 );

    if ( RetValue == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        Lits[0] = lit_neg( Lits[0] );
        Lits[1] = lit_neg( Lits[1] );
        RetValue = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
        assert( RetValue );
        p->nSatUnsat++;
        p->nConfUnsat += p->pSat->stats.conflicts - nConflicts;       
//Abc_Print( 1, "UNSAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 1;
    }
    else if ( RetValue == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatSat++;
        p->nConfSat += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "SAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 0;
    }
    else // if ( RetValue == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatUndec++;
        p->nConfUndec += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "UNDEC after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return -1;
    }
}